

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O1

void __thiscall cmComputeLinkDepends::OrderLinkEntires(cmComputeLinkDepends *this)

{
  int *piVar1;
  cmComputeComponentGraph *pcVar2;
  size_type __new_size;
  int iVar3;
  pointer __p;
  int *piVar4;
  int n;
  value_type local_2d;
  int local_2c;
  __uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_> local_28;
  
  pcVar2 = (cmComputeComponentGraph *)operator_new(0xd8);
  cmComputeComponentGraph::cmComputeComponentGraph(pcVar2,&this->EntryConstraintGraph);
  local_28._M_t.
  super__Tuple_impl<0UL,_cmComputeComponentGraph_*,_std::default_delete<cmComputeComponentGraph>_>.
  super__Head_base<0UL,_cmComputeComponentGraph_*,_false>._M_head_impl =
       (tuple<cmComputeComponentGraph_*,_std::default_delete<cmComputeComponentGraph>_>)
       (_Tuple_impl<0UL,_cmComputeComponentGraph_*,_std::default_delete<cmComputeComponentGraph>_>)
       0x0;
  std::__uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>::
  reset((__uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_> *)
        &this->CCG,pcVar2);
  std::unique_ptr<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>::
  ~unique_ptr((unique_ptr<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_> *)
              &local_28);
  pcVar2 = (this->CCG)._M_t.
           super___uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmComputeComponentGraph_*,_std::default_delete<cmComputeComponentGraph>_>
           .super__Head_base<0UL,_cmComputeComponentGraph_*,_false>._M_head_impl;
  __new_size = ((long)*(pointer *)
                       ((long)&(pcVar2->ComponentGraph).
                               super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_> + 8)
                - *(long *)&(pcVar2->ComponentGraph).
                            super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                            super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_> >>
               3) * -0x5555555555555555;
  local_2c = (int)__new_size;
  local_2d = '\0';
  std::vector<char,_std::allocator<char>_>::resize(&this->ComponentVisited,__new_size,&local_2d);
  std::vector<int,_std::allocator<int>_>::resize
            (&this->ComponentOrder,
             ((long)*(pointer *)
                     ((long)&(pcVar2->ComponentGraph).
                             super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_> + 8) -
              *(long *)&(pcVar2->ComponentGraph).
                        super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                        super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_> >> 3)
             * -0x5555555555555555,&local_2c);
  this->ComponentOrderId = local_2c;
  if (0 < local_2c) {
    iVar3 = local_2c + 1;
    do {
      VisitComponent(this,iVar3 - 2);
      iVar3 = iVar3 + -1;
    } while (1 < iVar3);
  }
  if (this->DebugMode != false) {
    DisplayComponents(this);
  }
  piVar1 = (this->OriginalEntries).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar4 = (this->OriginalEntries).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar4 != piVar1; piVar4 = piVar4 + 1) {
    VisitEntry(this,*piVar4);
  }
  while ((this->PendingComponents)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    VisitEntry(this,(this->PendingComponents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                    [2]._M_parent[1]._M_color);
  }
  return;
}

Assistant:

void cmComputeLinkDepends::OrderLinkEntires()
{
  // Compute the DAG of strongly connected components.  The algorithm
  // used by cmComputeComponentGraph should identify the components in
  // the same order in which the items were originally discovered in
  // the BFS.  This should preserve the original order when no
  // constraints disallow it.
  this->CCG =
    cm::make_unique<cmComputeComponentGraph>(this->EntryConstraintGraph);

  // The component graph is guaranteed to be acyclic.  Start a DFS
  // from every entry to compute a topological order for the
  // components.
  Graph const& cgraph = this->CCG->GetComponentGraph();
  int n = static_cast<int>(cgraph.size());
  this->ComponentVisited.resize(cgraph.size(), 0);
  this->ComponentOrder.resize(cgraph.size(), n);
  this->ComponentOrderId = n;
  // Run in reverse order so the topological order will preserve the
  // original order where there are no constraints.
  for (int c = n - 1; c >= 0; --c) {
    this->VisitComponent(c);
  }

  // Display the component graph.
  if (this->DebugMode) {
    this->DisplayComponents();
  }

  // Start with the original link line.
  for (int originalEntry : this->OriginalEntries) {
    this->VisitEntry(originalEntry);
  }

  // Now explore anything left pending.  Since the component graph is
  // guaranteed to be acyclic we know this will terminate.
  while (!this->PendingComponents.empty()) {
    // Visit one entry from the first pending component.  The visit
    // logic will update the pending components accordingly.  Since
    // the pending components are kept in topological order this will
    // not repeat one.
    int e = *this->PendingComponents.begin()->second.Entries.begin();
    this->VisitEntry(e);
  }
}